

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-SFML.cpp
# Opt level: O1

void ImGui::SFML::Shutdown(void)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  WindowContext *in_RSI;
  pointer *__ptr;
  undefined8 *puVar3;
  
  (anonymous_namespace)::s_currWindowCtx = 0;
  SetCurrentContext((ImGuiContext *)0x0);
  puVar2 = DAT_0022f120;
  puVar1 = (anonymous_namespace)::s_windowContexts;
  puVar3 = (anonymous_namespace)::s_windowContexts;
  if (DAT_0022f120 != (anonymous_namespace)::s_windowContexts) {
    do {
      if ((default_delete<(anonymous_namespace)::WindowContext> *)*puVar3 !=
          (default_delete<(anonymous_namespace)::WindowContext> *)0x0) {
        std::default_delete<(anonymous_namespace)::WindowContext>::operator()
                  ((default_delete<(anonymous_namespace)::WindowContext> *)*puVar3,in_RSI);
      }
      *puVar3 = 0;
      puVar3 = puVar3 + 1;
    } while (puVar3 != puVar2);
    DAT_0022f120 = puVar1;
  }
  return;
}

Assistant:

void Shutdown() {
    s_currWindowCtx = nullptr;
    ImGui::SetCurrentContext(nullptr);

    s_windowContexts.clear();
}